

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::createMaterial_matte(SemanticParser *this,SP *in)

{
  long lVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  runtime_error *this_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  float fVar5;
  SP SVar6;
  SP mat;
  undefined1 local_f0 [48];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  
  std::make_shared<pbrt::MatteMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mat);
  lVar1 = *in_RDX;
  p_Var4 = *(_Rb_tree_node_base **)(lVar1 + 0x18);
  do {
    _Var2._M_pi = mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (p_Var4 == (_Rb_tree_node_base *)(lVar1 + 8)) {
      mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var2._M_pi;
      mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (SP)SVar6.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(&it,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
                *)(p_Var4 + 1));
    std::__cxx11::string::string((string *)&name,(string *)&it);
    bVar3 = std::operator==(&name,"Kd");
    if (bVar3) {
      bVar3 = syntactic::ParamSet::hasParamTexture((ParamSet *)*in_RDX,&name);
      if (bVar3) {
        ((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).x =
             1.0;
        ((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).y =
             1.0;
        ((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->kd).z =
             1.0;
        syntactic::ParamSet::getParamTexture((ParamSet *)local_b0,(string *)*in_RDX);
        findOrCreateTexture((SemanticParser *)local_f0,(SP *)in);
        std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
      }
      else {
        syntactic::ParamSet::getParam3f
                  ((ParamSet *)*in_RDX,
                   &((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->kd).x,&name);
      }
    }
    else {
      bVar3 = std::operator==(&name,"sigma");
      if (bVar3) {
        bVar3 = syntactic::ParamSet::hasParam1f((ParamSet *)*in_RDX,&name);
        if (bVar3) {
          fVar5 = syntactic::ParamSet::getParam1f((ParamSet *)*in_RDX,&name,0.0);
          (mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->sigma =
               fVar5;
        }
        else {
          syntactic::ParamSet::getParamTexture((ParamSet *)local_c0,(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_f0,(SP *)in);
          std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->map_sigma).
                      super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
          this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8);
LAB_00152318:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_01);
        }
      }
      else {
        bVar3 = std::operator==(&name,"type");
        if (!bVar3) {
          bVar3 = std::operator==(&name,"bumpmap");
          if (!bVar3) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::operator+(&local_a0,"un-handled matte-material parameter \'",&it.first);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0,&local_a0,"\'");
            std::runtime_error::runtime_error(this_00,(string *)local_f0);
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          syntactic::ParamSet::getParamTexture((ParamSet *)(local_f0 + 0x20),(string *)*in_RDX);
          findOrCreateTexture((SemanticParser *)local_f0,(SP *)in);
          std::__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&((mat.super___shared_ptr<pbrt::MatteMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->map_bump).
                      super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
          this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 0x28);
          goto LAB_00152318;
        }
      }
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(&it);
    p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_matte(pbrt::syntactic::Material::SP in)
  {
    MatteMaterial::SP mat = std::make_shared<MatteMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kd") {
        if (in->hasParamTexture(name)) {
          mat->kd = vec3f(1.f);
          mat->map_kd = findOrCreateTexture(in->getParamTexture(name));
        } else
          in->getParam3f(&mat->kd.x,name);
      }
      else if (name == "sigma") {
        if (in->hasParam1f(name))
          mat->sigma = in->getParam1f(name);
        else 
          mat->map_sigma = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      } else
        throw std::runtime_error("un-handled matte-material parameter '"+it.first+"'");
    };
    return mat;
  }